

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_AmrMesh.H
# Opt level: O0

AmrMesh * __thiscall amrex::AmrMesh::operator=(AmrMesh *this,AmrMesh *rhs)

{
  AmrInfo *in_RSI;
  AmrMesh *in_RDI;
  
  AmrInfo::operator=(in_RSI,(AmrInfo *)in_RDI);
  *(int *)&(in_RDI->super_AmrInfo).field_0x8c = in_RSI[1].max_level;
  Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>::operator=
            ((Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_> *)in_RSI,
             (Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_> *)in_RDI);
  Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>::operator=
            ((Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_> *)
             in_RSI,(Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>
                     *)in_RDI);
  Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>::operator=
            ((Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_> *)in_RSI,
             (Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_> *)in_RDI);
  *(pointer *)&in_RDI->num_setdm =
       in_RSI[1].n_error_buf.super_vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>.
       super__Vector_base<amrex::IntVect,_std::allocator<amrex::IntVect>_>._M_impl.
       super__Vector_impl_data._M_start;
  return in_RDI;
}

Assistant:

AmrMesh& operator= (AmrMesh&& rhs) = default;